

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derDec4(octet *der,size_t count,u32 tag,void *val,size_t len)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  u32 t;
  size_t l;
  u32 local_34;
  size_t local_30;
  
  sVar2 = derTLDec(&local_34,&local_30,der,count);
  sVar3 = 0xffffffffffffffff;
  if (sVar2 == 0xffffffffffffffff) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar2;
    uVar4 = 0xffffffffffffffff;
    if (local_30 + sVar2 <= count) {
      uVar4 = local_30 + sVar2;
    }
  }
  if (((uVar4 != 0xffffffffffffffff) && (local_34 == tag)) && (local_30 == len)) {
    bVar1 = memEq(der,val,len);
    sVar3 = -(ulong)(bVar1 == 0) | uVar4;
  }
  return sVar3;
}

Assistant:

size_t derDec4(const octet der[], size_t count, u32 tag, const void* val,
	size_t len)
{
	u32 t;
	const octet* v;
	size_t l;
	ASSERT(memIsValid(val, len));
	count = derDec(&t, &v, &l, der, count);
	if (count == SIZE_MAX || t != tag || l != len || !memEq(v, val, len))
		return SIZE_MAX;
	return count;
}